

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O1

CURLcode tftp_tx(tftp_state_data *state,tftp_event_t event)

{
  unsigned_short uVar1;
  int iVar2;
  Curl_easy *data;
  curl_trc_feat *pcVar3;
  bool bVar4;
  ushort uVar5;
  CURLcode CVar6;
  time_t tVar7;
  ssize_t sVar8;
  int *piVar9;
  char *pcVar10;
  ulong uVar11;
  CURLcode unaff_EBP;
  curl_off_t size;
  uchar *buf;
  _Bool eos;
  size_t cb;
  char buffer [256];
  _Bool local_141;
  size_t local_140;
  char local_138 [264];
  
  data = state->data;
  switch(event) {
  case TFTP_EVENT_ACK:
    uVar5 = *(ushort *)((state->rpacket).data + 2);
    uVar5 = uVar5 << 8 | uVar5 >> 8;
    if ((uVar5 == state->block) || ((state->block == 0 && (uVar5 == 0xffff)))) {
      tVar7 = time((time_t *)0x0);
      state->rx_time = tVar7;
      state->block = state->block + 1;
      bVar4 = true;
    }
    else {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
      {
        Curl_infof(data,"Received ACK for block %d, expecting %d",(ulong)uVar5);
      }
      iVar2 = state->retries;
      state->retries = iVar2 + 1;
      if (iVar2 < state->retry_max) {
        sVar8 = sendto(state->sockfd,(state->spacket).data,state->sbytes + 4,0x4000,
                       (sockaddr *)&state->remote_addr,state->remote_addrlen);
        bVar4 = false;
        unaff_EBP = CURLE_OK;
        if (-1 < sVar8) goto LAB_001602e3;
        piVar9 = __errno_location();
        pcVar10 = Curl_strerror(*piVar9,local_138,0x100);
        Curl_failf(data,"%s",pcVar10);
      }
      else {
        Curl_failf(data,"tftp_tx: giving up waiting for block %d ack",(ulong)state->block);
      }
      bVar4 = false;
      unaff_EBP = CURLE_SEND_ERROR;
    }
LAB_001602e3:
    if (!bVar4) {
      return unaff_EBP;
    }
    break;
  case TFTP_EVENT_ERROR:
    state->state = TFTP_STATE_FIN;
    *(state->spacket).data = '\0';
    (state->spacket).data[1] = '\x05';
    uVar1 = state->block;
    (state->spacket).data[2] = (uchar)(uVar1 >> 8);
    (state->spacket).data[3] = (uchar)uVar1;
    sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
           state->remote_addrlen);
    state->state = TFTP_STATE_FIN;
    return CURLE_OK;
  case TFTP_EVENT_OACK:
    state->block = 1;
    break;
  case TFTP_EVENT_TIMEOUT:
    state->retries = state->retries + 1;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) {
      Curl_infof(data,"Timeout waiting for block %d ACK.  Retries = %d",
                 (ulong)(*(int *)&state->block + 1U & 0xffff));
    }
    if (state->retries <= state->retry_max) {
      sVar8 = sendto(state->sockfd,(state->spacket).data,state->sbytes + 4,0x4000,
                     (sockaddr *)&state->remote_addr,state->remote_addrlen);
      if (sVar8 < 0) goto LAB_0016054a;
      size = (data->req).writebytecount;
      goto LAB_0016052c;
    }
    state->error = TFTP_ERR_TIMEOUT;
    goto LAB_00160467;
  default:
    Curl_failf(data,"tftp_tx: internal error, event: %i");
    return CURLE_OK;
  }
  state->retries = 0;
  *(state->spacket).data = '\0';
  (state->spacket).data[1] = '\x03';
  uVar1 = state->block;
  (state->spacket).data[2] = (uchar)(uVar1 >> 8);
  (state->spacket).data[3] = (uchar)uVar1;
  if ((state->block < 2) || ((ulong)state->blksize <= state->sbytes)) {
    state->sbytes = 0;
    buf = (state->spacket).data + 4;
    do {
      CVar6 = Curl_client_read(data,(char *)buf,(ulong)state->blksize - state->sbytes,&local_140,
                               &local_141);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      uVar11 = state->sbytes + local_140;
      state->sbytes = uVar11;
    } while ((local_140 != 0) && (buf = buf + local_140, uVar11 < state->blksize));
    sVar8 = sendto(state->sockfd,(state->spacket).data,uVar11 + 4,0x4000,
                   (sockaddr *)&state->remote_addr,state->remote_addrlen);
    if (sVar8 < 0) {
LAB_0016054a:
      piVar9 = __errno_location();
      pcVar10 = Curl_strerror(*piVar9,local_138,0x100);
      Curl_failf(data,"%s",pcVar10);
      return CURLE_SEND_ERROR;
    }
    size = (data->req).writebytecount + state->sbytes;
    (data->req).writebytecount = size;
LAB_0016052c:
    Curl_pgrsSetUploadCounter(data,size);
  }
  else {
LAB_00160467:
    state->state = TFTP_STATE_FIN;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode tftp_tx(struct tftp_state_data *state, tftp_event_t event)
{
  struct Curl_easy *data = state->data;
  ssize_t sbytes;
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  size_t cb; /* Bytes currently read */
  char buffer[STRERROR_LEN];
  char *bufptr;
  bool eos;

  switch(event) {

  case TFTP_EVENT_ACK:
  case TFTP_EVENT_OACK:
    if(event == TFTP_EVENT_ACK) {
      /* Ack the packet */
      int rblock = getrpacketblock(&state->rpacket);

      if(rblock != state->block &&
         /* There is a bug in tftpd-hpa that causes it to send us an ack for
          * 65535 when the block number wraps to 0. So when we are expecting
          * 0, also accept 65535. See
          * https://www.syslinux.org/archives/2010-September/015612.html
          * */
         !(state->block == 0 && rblock == 65535)) {
        /* This is not the expected block. Log it and up the retry counter */
        infof(data, "Received ACK for block %d, expecting %d",
              rblock, state->block);
        state->retries++;
        /* Bail out if over the maximum */
        if(state->retries > state->retry_max) {
          failf(data, "tftp_tx: giving up waiting for block %d ack",
                state->block);
          result = CURLE_SEND_ERROR;
        }
        else {
          /* Re-send the data packet */
          sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                          4 + (SEND_TYPE_ARG3)state->sbytes, SEND_4TH_ARG,
                          (struct sockaddr *)&state->remote_addr,
                          state->remote_addrlen);
          /* Check all sbytes were sent */
          if(sbytes < 0) {
            failf(data, "%s", Curl_strerror(SOCKERRNO,
                                            buffer, sizeof(buffer)));
            result = CURLE_SEND_ERROR;
          }
        }

        return result;
      }
      /* This is the expected packet. Reset the counters and send the next
         block */
      state->rx_time = time(NULL);
      state->block++;
    }
    else
      state->block = 1; /* first data block is 1 when using OACK */

    state->retries = 0;
    setpacketevent(&state->spacket, TFTP_EVENT_DATA);
    setpacketblock(&state->spacket, state->block);
    if(state->block > 1 && state->sbytes < state->blksize) {
      state->state = TFTP_STATE_FIN;
      return CURLE_OK;
    }

    /* TFTP considers data block size < 512 bytes as an end of session. So
     * in some cases we must wait for additional data to build full (512 bytes)
     * data block.
     * */
    state->sbytes = 0;
    bufptr = (char *)state->spacket.data + 4;
    do {
      result = Curl_client_read(data, bufptr, state->blksize - state->sbytes,
                                &cb, &eos);
      if(result)
        return result;
      state->sbytes += cb;
      bufptr += cb;
    } while(state->sbytes < state->blksize && cb);

    sbytes = sendto(state->sockfd, (void *) state->spacket.data,
                    4 + (SEND_TYPE_ARG3)state->sbytes, SEND_4TH_ARG,
                    (struct sockaddr *)&state->remote_addr,
                    state->remote_addrlen);
    /* Check all sbytes were sent */
    if(sbytes < 0) {
      failf(data, "%s", Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      return CURLE_SEND_ERROR;
    }
    /* Update the progress meter */
    k->writebytecount += state->sbytes;
    Curl_pgrsSetUploadCounter(data, k->writebytecount);
    break;

  case TFTP_EVENT_TIMEOUT:
    /* Increment the retry counter and log the timeout */
    state->retries++;
    infof(data, "Timeout waiting for block %d ACK. "
          " Retries = %d", NEXT_BLOCKNUM(state->block), state->retries);
    /* Decide if we have had enough */
    if(state->retries > state->retry_max) {
      state->error = TFTP_ERR_TIMEOUT;
      state->state = TFTP_STATE_FIN;
    }
    else {
      /* Re-send the data packet */
      sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                      4 + (SEND_TYPE_ARG3)state->sbytes, SEND_4TH_ARG,
                      (struct sockaddr *)&state->remote_addr,
                      state->remote_addrlen);
      /* Check all sbytes were sent */
      if(sbytes < 0) {
        failf(data, "%s", Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
        return CURLE_SEND_ERROR;
      }
      /* since this was a re-send, we remain at the still byte position */
      Curl_pgrsSetUploadCounter(data, k->writebytecount);
    }
    break;

  case TFTP_EVENT_ERROR:
    state->state = TFTP_STATE_FIN;
    setpacketevent(&state->spacket, TFTP_EVENT_ERROR);
    setpacketblock(&state->spacket, state->block);
    (void)sendto(state->sockfd, (void *)state->spacket.data, 4, SEND_4TH_ARG,
                 (struct sockaddr *)&state->remote_addr,
                 state->remote_addrlen);
    /* do not bother with the return code, but if the socket is still up we
     * should be a good TFTP client and let the server know we are done */
    state->state = TFTP_STATE_FIN;
    break;

  default:
    failf(data, "tftp_tx: internal error, event: %i", (int)(event));
    break;
  }

  return result;
}